

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationInvarianceTests.cpp
# Opt level: O2

bool __thiscall
vkt::tessellation::anon_unknown_0::PrimitiveSetInvariance::InvariantOuterTriangleSetTestInstance::
compare(InvariantOuterTriangleSetTestInstance *this,PerPrimitiveVec *primitivesA,
       PerPrimitiveVec *primitivesB,int outerEdgeNdx)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  ostringstream *poVar3;
  float fVar4;
  float fVar5;
  TessPrimitiveType TVar6;
  TestLog *pTVar7;
  pointer pPVar8;
  pointer pPVar9;
  pointer pPVar10;
  pointer pPVar11;
  bool bVar12;
  PerPrimitiveVec *pPVar13;
  ulong uVar14;
  _Rb_tree_node_base *p_Var15;
  _Rb_tree_node_base *p_Var16;
  _Base_ptr p_Var17;
  _Base_ptr p_Var18;
  long lVar19;
  set<tcu::Vector<tcu::Vector<float,_3>,_3>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
  *psVar20;
  long lVar21;
  Vector<tcu::Vector<float,_3>,_3> *b;
  Vector<tcu::Vector<float,_3>,_3> *b_00;
  ulong uVar22;
  Vector<float,_3> *v;
  int iVar23;
  long lVar24;
  Vector<float,_3> *v_00;
  int aOrB;
  int iVar25;
  ulong uVar26;
  bool bVar27;
  bool bVar28;
  float local_328;
  Vec3 avg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  TriangleSet trianglesB;
  TriangleSet trianglesA;
  _Vector_base<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription>_>
  local_208;
  string local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  Triangle triangle;
  float local_18c [87];
  
  TVar6 = (this->super_InvarianceTestInstance).m_caseDef.primitiveType;
  lVar19 = (long)outerEdgeNdx;
  if (TVar6 == TESSPRIMITIVETYPE_QUADS) {
    pTVar7 = ((this->super_InvarianceTestInstance).super_TestInstance.m_context)->m_testCtx->m_log;
    outerEdgeDescriptions
              ((vector<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription>_>
                *)&local_208,TESSPRIMITIVETYPE_QUADS);
    tessellation::(anonymous_namespace)::OuterEdgeDescription::description_abi_cxx11_
              (&local_1f0,local_208._M_impl.super__Vector_impl_data._M_start + lVar19);
    std::operator+(&local_1d0,
                   "inner triangles, and outer triangles corresponding to other edge than edge ",
                   &local_1f0);
    pPVar8 = (primitivesA->
             super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    pPVar9 = (primitivesA->
             super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pPVar10 = (primitivesB->
              super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    pPVar11 = (primitivesB->
              super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
              )._M_impl.super__Vector_impl_data._M_start;
    iVar23 = 0;
    trianglesA._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &trianglesA._M_t._M_impl.super__Rb_tree_header._M_header;
    trianglesA._M_t._M_impl._0_1_ = 0;
    trianglesA._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    trianglesA._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    trianglesA._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    trianglesB._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &trianglesB._M_t._M_impl.super__Rb_tree_header._M_header;
    trianglesB._M_t._M_impl._0_1_ = 0;
    trianglesB._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    trianglesB._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    trianglesB._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    iVar25 = outerEdgeNdx % 2;
    local_328 = 0.0;
    if (1 < outerEdgeNdx) {
      local_328 = 1.0;
    }
    trianglesB._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         trianglesB._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    trianglesA._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         trianglesA._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (; p_Var15 = trianglesA._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
        p_Var16 = trianglesB._M_t._M_impl.super__Rb_tree_header._M_header._M_left, iVar23 != 2;
        iVar23 = iVar23 + 1) {
      uVar22 = (long)pPVar10 - (long)pPVar11;
      if (iVar23 == 0) {
        uVar22 = (long)pPVar8 - (long)pPVar9;
      }
      psVar20 = &trianglesB;
      if (iVar23 == 0) {
        psVar20 = &trianglesA;
      }
      uVar26 = uVar22 >> 6 & 0xffffffff;
      if ((int)(uVar22 >> 6) < 1) {
        uVar26 = 0;
      }
      for (uVar22 = 0; uVar22 != uVar26; uVar22 = uVar22 + 1) {
        pPVar13 = primitivesB;
        if (iVar23 == 0) {
          pPVar13 = primitivesA;
        }
        makeTriangle(&triangle,
                     (pPVar13->
                     super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                     )._M_impl.super__Vector_impl_data._M_start + uVar22);
        v_00 = triangle.m_data;
        lVar19 = 0;
        while (lVar19 != 3) {
          lVar24 = lVar19 + 1;
          lVar21 = 0;
          if (lVar24 != 3) {
            lVar21 = lVar24;
          }
          uVar14 = (ulong)((int)lVar19 - 1);
          if (lVar19 == 0) {
            uVar14 = 2;
          }
          v = triangle.m_data + lVar21;
          fVar4 = ((Vector<float,_3> *)v_00->m_data)->m_data[iVar25];
          if (fVar4 == local_328) {
            if ((v->m_data[iVar25] != local_328) || (NAN(v->m_data[iVar25]) || NAN(local_328)))
            goto LAB_0070c325;
LAB_0070c367:
            std::
            sort<tcu::Vector<float,3>*,vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>>
                      (&triangle,local_18c);
            std::
            set<tcu::Vector<tcu::Vector<float,_3>,_3>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
            ::insert(psVar20,&triangle);
            break;
          }
LAB_0070c325:
          fVar5 = triangle.m_data[uVar14].m_data[iVar25];
          if ((fVar5 == local_328) &&
             (((!NAN(fVar5) && !NAN(local_328) &&
               (bVar12 = IsQuadTriangleOnOuterEdge::onAnyEdge(v_00), !bVar12)) &&
              (bVar12 = IsQuadTriangleOnOuterEdge::onAnyEdge(v), !bVar12)))) {
            if ((fVar4 == v->m_data[iVar25]) && (!NAN(fVar4) && !NAN(v->m_data[iVar25])))
            goto LAB_0070c367;
          }
          v_00 = v_00 + 1;
          lVar19 = lVar24;
        }
      }
    }
    while( true ) {
      bVar28 = (_Rb_tree_header *)p_Var15 == &trianglesA._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = &trianglesB._M_t._M_impl.super__Rb_tree_header;
      bVar27 = (_Rb_tree_header *)p_Var16 == p_Var1;
      bVar12 = bVar28 && bVar27;
      if (bVar12) break;
      if (((_Rb_tree_header *)p_Var16 == p_Var1) ||
         ((_Rb_tree_header *)p_Var15 == &trianglesA._M_t._M_impl.super__Rb_tree_header)) {
LAB_0070c4a3:
        poVar3 = (ostringstream *)(triangle.m_data[0].m_data + 2);
        triangle.m_data[0].m_data._0_8_ = pTVar7;
        std::__cxx11::ostringstream::ostringstream(poVar3);
        std::operator<<((ostream *)poVar3,
                        "Failure: triangle sets in two cases are not equal (when ignoring triangle and vertex order"
                       );
        if (local_1d0._M_dataplus._M_p == (char *)0x0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&avg,"",(allocator<char> *)&local_2a8);
        }
        else {
          local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
          local_288._M_string_length = 0;
          local_288.field_2._M_local_buf[0] = '\0';
          std::operator+(&local_2a8,&local_288,", and ");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&avg,
                         &local_2a8,local_1d0._M_dataplus._M_p);
        }
        std::operator<<((ostream *)poVar3,(string *)&avg);
        std::operator<<((ostream *)poVar3,")");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&triangle,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::string::~string((string *)&avg);
        if (local_1d0._M_dataplus._M_p != (char *)0x0) {
          std::__cxx11::string::~string((string *)&local_2a8);
          std::__cxx11::string::~string((string *)&local_288);
        }
        std::__cxx11::ostringstream::~ostringstream(poVar3);
        if ((bVar28) ||
           ((!bVar27 &&
            (bVar27 = LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>
                      ::operator()((LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>
                                    *)(p_Var15 + 1),
                                   (Vector<tcu::Vector<float,_3>,_3> *)(p_Var16 + 1),b), !bVar27))))
        {
          poVar3 = (ostringstream *)(triangle.m_data[0].m_data + 2);
          triangle.m_data[0].m_data._0_8_ = pTVar7;
          std::__cxx11::ostringstream::ostringstream(poVar3);
          std::operator<<((ostream *)poVar3,"Note: e.g. triangle ");
          tcu::operator<<((ostream *)poVar3,(Vector<tcu::Vector<float,_3>,_3> *)(p_Var16 + 1));
          std::operator<<((ostream *)poVar3," exists for second case but not for first");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)&triangle,(EndMessageToken *)&tcu::TestLog::EndMessage);
        }
        else {
          poVar3 = (ostringstream *)(triangle.m_data[0].m_data + 2);
          triangle.m_data[0].m_data._0_8_ = pTVar7;
          std::__cxx11::ostringstream::ostringstream(poVar3);
          std::operator<<((ostream *)poVar3,"Note: e.g. triangle ");
          tcu::operator<<((ostream *)poVar3,(Vector<tcu::Vector<float,_3>,_3> *)(p_Var15 + 1));
          std::operator<<((ostream *)poVar3," exists for first case but not for second");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)&triangle,(EndMessageToken *)&tcu::TestLog::EndMessage);
        }
        goto LAB_0070c852;
      }
      bVar27 = tcu::Vector<tcu::Vector<float,_3>,_3>::operator!=
                         ((Vector<tcu::Vector<float,_3>,_3> *)(p_Var15 + 1),
                          (Vector<tcu::Vector<float,_3>,_3> *)(p_Var16 + 1));
      if (bVar27) {
        bVar28 = false;
        bVar27 = false;
        goto LAB_0070c4a3;
      }
      p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15);
      p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16);
    }
  }
  else {
    if (TVar6 != TESSPRIMITIVETYPE_TRIANGLES) {
      return true;
    }
    pTVar7 = ((this->super_InvarianceTestInstance).super_TestInstance.m_context)->m_testCtx->m_log;
    outerEdgeDescriptions
              ((vector<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription>_>
                *)&local_208,TESSPRIMITIVETYPE_TRIANGLES);
    tessellation::(anonymous_namespace)::OuterEdgeDescription::description_abi_cxx11_
              (&local_1f0,local_208._M_impl.super__Vector_impl_data._M_start + lVar19);
    std::operator+(&local_1d0,
                   "inner triangles, and outer triangles corresponding to other edge than edge ",
                   &local_1f0);
    pPVar8 = (primitivesA->
             super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    pPVar9 = (primitivesA->
             super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pPVar10 = (primitivesB->
              super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    pPVar11 = (primitivesB->
              super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
              )._M_impl.super__Vector_impl_data._M_start;
    trianglesA._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &trianglesA._M_t._M_impl.super__Rb_tree_header._M_header;
    trianglesA._M_t._M_impl._0_1_ = 0;
    trianglesA._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    trianglesA._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    trianglesA._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    trianglesB._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &trianglesB._M_t._M_impl.super__Rb_tree_header._M_header;
    trianglesB._M_t._M_impl._0_1_ = 0;
    trianglesB._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    trianglesB._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    trianglesB._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    trianglesB._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         trianglesB._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    trianglesA._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         trianglesA._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (iVar25 = 0; iVar25 != 2; iVar25 = iVar25 + 1) {
      uVar22 = (long)pPVar10 - (long)pPVar11;
      if (iVar25 == 0) {
        uVar22 = (long)pPVar8 - (long)pPVar9;
      }
      psVar20 = &trianglesB;
      if (iVar25 == 0) {
        psVar20 = &trianglesA;
      }
      uVar26 = uVar22 >> 6 & 0xffffffff;
      if ((int)(uVar22 >> 6) < 1) {
        uVar26 = 0;
      }
      for (uVar22 = 0; uVar22 != uVar26; uVar22 = uVar22 + 1) {
        pPVar13 = primitivesB;
        if (iVar25 == 0) {
          pPVar13 = primitivesA;
        }
        makeTriangle(&triangle,
                     (pPVar13->
                     super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                     )._M_impl.super__Vector_impl_data._M_start + uVar22);
        bVar12 = false;
        for (lVar21 = -0x24; lVar21 != 0; lVar21 = lVar21 + 0xc) {
          bVar12 = (bool)(bVar12 | *(float *)((long)local_18c + lVar21 + lVar19 * 4) == 0.0);
        }
        if (bVar12) {
          tcu::operator+((tcu *)&local_288,triangle.m_data,triangle.m_data + 1);
          tcu::operator+((tcu *)&local_2a8,(Vector<float,_3> *)&local_288,triangle.m_data + 2);
          tcu::operator/((tcu *)&avg,(Vector<float,_3> *)&local_2a8,3.0);
          if ((avg.m_data[lVar19] < avg.m_data[(outerEdgeNdx + 1) % 3]) &&
             (avg.m_data[lVar19] < avg.m_data[(outerEdgeNdx + 2) % 3])) {
            std::
            sort<tcu::Vector<float,3>*,vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>>
                      (&triangle,local_18c);
            std::
            set<tcu::Vector<tcu::Vector<float,_3>,_3>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
            ::insert(psVar20,&triangle);
          }
        }
      }
    }
    p_Var1 = &trianglesA._M_t._M_impl.super__Rb_tree_header;
    p_Var17 = trianglesA._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var18 = trianglesB._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while( true ) {
      p_Var2 = &trianglesB._M_t._M_impl.super__Rb_tree_header;
      bVar27 = (_Rb_tree_header *)p_Var17 == p_Var1;
      bVar28 = (_Rb_tree_header *)p_Var18 == p_Var2;
      bVar12 = bVar27 && bVar28;
      if (bVar12) break;
      if (((_Rb_tree_header *)p_Var18 == p_Var2) || ((_Rb_tree_header *)p_Var17 == p_Var1)) {
LAB_0070c528:
        poVar3 = (ostringstream *)(triangle.m_data[0].m_data + 2);
        triangle.m_data[0].m_data._0_8_ = pTVar7;
        std::__cxx11::ostringstream::ostringstream(poVar3);
        std::operator<<((ostream *)poVar3,
                        "Failure: triangle sets in two cases are not equal (when ignoring triangle and vertex order"
                       );
        if (local_1d0._M_dataplus._M_p == (char *)0x0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&avg,"",(allocator<char> *)&local_2a8);
        }
        else {
          local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
          local_288._M_string_length = 0;
          local_288.field_2._M_local_buf[0] = '\0';
          std::operator+(&local_2a8,&local_288,", and ");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&avg,
                         &local_2a8,local_1d0._M_dataplus._M_p);
        }
        std::operator<<((ostream *)poVar3,(string *)&avg);
        std::operator<<((ostream *)poVar3,")");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&triangle,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::string::~string((string *)&avg);
        if (local_1d0._M_dataplus._M_p != (char *)0x0) {
          std::__cxx11::string::~string((string *)&local_2a8);
          std::__cxx11::string::~string((string *)&local_288);
        }
        std::__cxx11::ostringstream::~ostringstream(poVar3);
        if ((bVar27) ||
           ((!bVar28 &&
            (bVar27 = LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>
                      ::operator()((LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>
                                    *)(p_Var17 + 1),
                                   (Vector<tcu::Vector<float,_3>,_3> *)(p_Var18 + 1),b_00), !bVar27)
            ))) {
          poVar3 = (ostringstream *)(triangle.m_data[0].m_data + 2);
          triangle.m_data[0].m_data._0_8_ = pTVar7;
          std::__cxx11::ostringstream::ostringstream(poVar3);
          std::operator<<((ostream *)poVar3,"Note: e.g. triangle ");
          tcu::operator<<((ostream *)poVar3,(Vector<tcu::Vector<float,_3>,_3> *)(p_Var18 + 1));
          std::operator<<((ostream *)poVar3," exists for second case but not for first");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)&triangle,(EndMessageToken *)&tcu::TestLog::EndMessage);
        }
        else {
          poVar3 = (ostringstream *)(triangle.m_data[0].m_data + 2);
          triangle.m_data[0].m_data._0_8_ = pTVar7;
          std::__cxx11::ostringstream::ostringstream(poVar3);
          std::operator<<((ostream *)poVar3,"Note: e.g. triangle ");
          tcu::operator<<((ostream *)poVar3,(Vector<tcu::Vector<float,_3>,_3> *)(p_Var17 + 1));
          std::operator<<((ostream *)poVar3," exists for first case but not for second");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)&triangle,(EndMessageToken *)&tcu::TestLog::EndMessage);
        }
LAB_0070c852:
        std::__cxx11::ostringstream::~ostringstream
                  ((ostringstream *)(triangle.m_data[0].m_data + 2));
        break;
      }
      bVar27 = tcu::Vector<tcu::Vector<float,_3>,_3>::operator!=
                         ((Vector<tcu::Vector<float,_3>,_3> *)(p_Var17 + 1),
                          (Vector<tcu::Vector<float,_3>,_3> *)(p_Var18 + 1));
      if (bVar27) {
        bVar27 = false;
        bVar28 = false;
        goto LAB_0070c528;
      }
      p_Var17 = (_Base_ptr)std::_Rb_tree_increment(p_Var17);
      p_Var18 = (_Base_ptr)std::_Rb_tree_increment(p_Var18);
    }
  }
  std::
  set<tcu::Vector<tcu::Vector<float,_3>,_3>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
  ::~set(&trianglesB);
  std::
  set<tcu::Vector<tcu::Vector<float,_3>,_3>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
  ::~set(&trianglesA);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::
  _Vector_base<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription>_>
  ::~_Vector_base(&local_208);
  return bVar12;
}

Assistant:

bool compare (const PerPrimitiveVec& primitivesA, const PerPrimitiveVec& primitivesB, const int outerEdgeNdx) const
	{
		if (m_caseDef.primitiveType == TESSPRIMITIVETYPE_TRIANGLES)
		{
			return compareTriangleSets(primitivesA, primitivesB, m_context.getTestContext().getLog(),
									   IsTriangleTriangleOnOuterEdge(outerEdgeNdx),
									   ("inner triangles, and outer triangles corresponding to other edge than edge "
										+ outerEdgeDescriptions(m_caseDef.primitiveType)[outerEdgeNdx].description()).c_str());
		}
		else if (m_caseDef.primitiveType == TESSPRIMITIVETYPE_QUADS)
		{
			return compareTriangleSets(primitivesA, primitivesB, m_context.getTestContext().getLog(),
									   IsQuadTriangleOnOuterEdge(outerEdgeNdx),
									   ("inner triangles, and outer triangles corresponding to other edge than edge "
										+ outerEdgeDescriptions(m_caseDef.primitiveType)[outerEdgeNdx].description()).c_str());
		}
		else
			DE_ASSERT(false);

		return true;
	}